

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O3

bool __thiscall pg::SSPMSolver::lift(SSPMSolver *this,int v,int target,int *str,int pl)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  Game *pGVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  int *piVar10;
  int iVar11;
  bool bVar12;
  _label_vertex local_68;
  ulong local_58;
  int *local_50;
  ulong local_48;
  bitset *local_40;
  bitset *local_38;
  
  uVar9 = (ulong)v;
  if (this->pm_d[(long)this->l * uVar9] != -1) {
    pGVar6 = (this->super_Solver).game;
    uVar1 = pGVar6->_priority[uVar9];
    iVar11 = ~((int)(uVar1 + (pl == 0)) / 2) + this->h;
    local_50 = str;
    if ((this->super_Solver).trace < 2) {
      uVar7 = 1L << (uVar9 & 0x3f);
    }
    else {
      poVar5 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[37;1mupdating vertex ",0x17);
      local_68.g = (this->super_Solver).game;
      local_68.v = v;
      poVar5 = operator<<(poVar5,&local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," => ",4);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      local_58 = 1L << (uVar9 & 0x3f);
      pcVar8 = " (odd)";
      bVar12 = ((((this->super_Solver).game)->_owner)._bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0;
      if (!bVar12) {
        pcVar8 = " (even)";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,7 - (ulong)bVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m with current measure",0x18);
      stream_pm(this,(this->super_Solver).logger,v);
      poVar5 = (this->super_Solver).logger;
      cVar2 = (char)poVar5;
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + cVar2);
      uVar7 = local_58;
      std::ostream::put(cVar2);
      std::ostream::flush();
      pGVar6 = (this->super_Solver).game;
    }
    local_48 = uVar9 >> 6;
    if ((target == -1) || ((uint)(((pGVar6->_owner)._bits[local_48] & uVar7) != 0) != pl)) {
      iVar4 = pGVar6->_outedges[pGVar6->_firstouts[uVar9]];
      local_58 = uVar7;
      if (iVar4 != -1) {
        piVar10 = pGVar6->_outedges + (long)pGVar6->_firstouts[uVar9] + 1;
        local_38 = &this->tmp_b;
        local_40 = &this->best_b;
        bVar12 = true;
        do {
          if ((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar4 >> 6] >>
               ((long)iVar4 & 0x3fU) & 1) == 0) {
            to_tmp(this,iVar4);
            if (1 < (this->super_Solver).trace) {
              poVar5 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,"to successor ",0xd);
              local_68.g = (this->super_Solver).game;
              local_68.v = iVar4;
              poVar5 = operator<<(poVar5,&local_68);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," from",5);
              stream_tmp(this,(this->super_Solver).logger,this->h);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((this->super_Solver).logger," =>",3);
            }
            if ((uVar1 & 1) == pl) {
              prog_tmp(this,iVar11,this->h);
            }
            else {
              trunc_tmp(this,iVar11);
            }
            if (1 < (this->super_Solver).trace) {
              stream_tmp(this,(this->super_Solver).logger,this->h);
              poVar5 = (this->super_Solver).logger;
              cVar2 = (char)poVar5;
              std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
            }
            if (bVar12) {
LAB_0016ea59:
              bitset::operator=(local_40,local_38);
              memcpy(this->best_d,this->tmp_d,(ulong)(uint)this->l << 2);
              *local_50 = iVar4;
            }
            else {
              uVar9 = (((this->super_Solver).game)->_owner)._bits[local_48] & local_58;
              iVar3 = compare(this,iVar11);
              if ((uint)(uVar9 != 0) == pl) {
                if (0 < iVar3) goto LAB_0016ea59;
              }
              else if (iVar3 < 0) goto LAB_0016ea59;
            }
            bVar12 = false;
          }
          iVar4 = *piVar10;
          piVar10 = piVar10 + 1;
        } while (iVar4 != -1);
      }
      to_tmp(this,v);
      iVar11 = compare(this,iVar11);
      if (iVar11 < 0) {
        if (0 < (this->super_Solver).trace) {
          poVar5 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"\x1b[1;32mnew measure\x1b[m of \x1b[36;1m",0x20);
          local_68.g = (this->super_Solver).game;
          local_68.v = v;
          poVar5 = operator<<(poVar5,&local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m:",4);
          stream_best(this,(this->super_Solver).logger,this->h);
          poVar5 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," (to ",5);
          local_68.g = (this->super_Solver).game;
          local_68.v = *local_50;
          poVar5 = operator<<(poVar5,&local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
        }
        from_best(this,v);
        return true;
      }
    }
    else {
      to_tmp(this,target);
      if ((uVar1 & 1) == pl) {
        prog_tmp(this,iVar11,this->h);
      }
      else {
        trunc_tmp(this,iVar11);
      }
      to_best(this,v);
      iVar4 = compare(this,iVar11);
      if (0 < iVar4) {
        from_tmp(this,v);
        if (1 < (this->super_Solver).trace) {
          poVar5 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"to successor ",0xd);
          local_68.g = (this->super_Solver).game;
          local_68.v = target;
          poVar5 = operator<<(poVar5,&local_68);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
          stream_tmp(this,(this->super_Solver).logger,this->h);
          std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," =>",3);
        }
        if ((uVar1 & 1) == pl) {
          prog_tmp(this,iVar11,this->h);
        }
        else {
          trunc_tmp(this,iVar11);
        }
        iVar11 = (this->super_Solver).trace;
        if (1 < iVar11) {
          stream_tmp(this,(this->super_Solver).logger,this->h);
          poVar5 = (this->super_Solver).logger;
          cVar2 = (char)poVar5;
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
          iVar11 = (this->super_Solver).trace;
        }
        if (iVar11 < 1) {
          return true;
        }
        poVar5 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\x1b[32;1mnew measure\x1b[m of \x1b[36;1m",0x20);
        local_68.g = (this->super_Solver).game;
        local_68.v = v;
        poVar5 = operator<<(poVar5,&local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m:",4);
        stream_tmp(this,(this->super_Solver).logger,this->h);
        poVar5 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," (to ",5);
        local_68.g = (this->super_Solver).game;
        local_68.v = target;
        poVar5 = operator<<(poVar5,&local_68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
SSPMSolver::lift(int v, int target, int &str, int pl)
{
    // check if already Top
    if (pm_d[l*v] == -1) return false; // already Top

    const int pr = priority(v);
    const int pindex = pl == 0 ? h-(pr+1)/2-1 : h-pr/2-1;

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[37;1mupdating vertex " << label_vertex(v) << " (" << pr << " => " << pindex << ")" << (owner(v)?" (odd)":" (even)") << "\033[m with current measure";
        stream_pm(logger, v);
        logger << std::endl;
    }
#endif

    // if even owns and target is set, just check if specific target is better
    if (owner(v) == pl and target != -1) {
        to_tmp(target);
        if (pl == (pr&1)) prog_tmp(pindex, h);
        else trunc_tmp(pindex);
        to_best(v);
        if (compare(pindex) > 0) {
            from_tmp(v);
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "to successor " << label_vertex(target) << ":";
                stream_tmp(logger, h);
                logger << " =>";
            }
#endif
            if (pl == (pr&1)) prog_tmp(pindex, h);
            else trunc_tmp(pindex);
#ifndef NDEBUG
            if (trace >= 2) {
                stream_tmp(logger, h);
                logger << std::endl;
            }
#endif
#ifndef NDEBUG
            if (trace >= 1) {
                logger << "\033[32;1mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
                stream_tmp(logger, h);
                logger << " (to " << label_vertex(target) << ")\n";
            }
#endif
            return true;
        } else {
            return false;
        }
    }

    // compute best measure
    bool first = true;
    for (auto curedge = outs(v); *curedge != -1; curedge++) {
        int to = *curedge;
        if (disabled[to]) continue;
        to_tmp(to);
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "to successor " << label_vertex(to) << " from";
            stream_tmp(logger, h);
            logger << " =>";
        }
#endif
        if (pl == (pr&1)) prog_tmp(pindex, h);
        else trunc_tmp(pindex);
#ifndef NDEBUG
        if (trace >= 2) {
            stream_tmp(logger, h);
            logger << std::endl;
        }
#endif
        if (first) {
            tmp_to_best();
            str = to;
        } else if (owner(v) == pl) {
            // we want the max!
            if (compare(pindex) > 0) {
                tmp_to_best();
                str = to;
            }
        } else {
            // we want the min!
            if (compare(pindex) < 0) {
                tmp_to_best();
                str = to;
            }
        }
        first = false;
    }

    // set best to pm if higher
    to_tmp(v);
    if (compare(pindex) < 0) {
#ifndef NDEBUG
        if (trace >= 1) {
            logger << "\033[1;32mnew measure\033[m of \033[36;1m" << label_vertex(v) << "\033[m:";
            stream_best(logger, h);
            logger << " (to " << label_vertex(str) << ")\n";
        }
#endif
        from_best(v);
        return true;
    } else {
        return false;
    }
}